

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dispatch_finish<unsigned_int>(int gtid,ident_t *loc)

{
  kmp_info_t *pred;
  dispatch_private_info_t *obj;
  dispatch_shared_info_t *pdVar1;
  undefined8 in_RSI;
  int in_EDI;
  uint lower;
  dispatch_shared_info_template<unsigned_int> *sh;
  dispatch_private_info_template<unsigned_int> *pr;
  kmp_info_t *th;
  undefined4 in_stack_fffffffffffffff8;
  
  pred = __kmp_threads[in_EDI];
  if ((((pred->th).th_team)->t).t_serialized == 0) {
    obj = ((pred->th).th_dispatch)->th_dispatch_pr_current;
    pdVar1 = ((pred->th).th_dispatch)->th_dispatch_sh_current;
    if (obj->ordered_bumped == 0) {
      __kmp_wait_yield<unsigned_int>
                ((uint *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),(uint)((ulong)in_RSI >> 0x20),
                 (_func_kmp_uint32_uint_uint *)pred->th_pad,obj);
      test_then_inc<int>((kmp_int32 *)&(pdVar1->u).s32.ordered_iteration);
    }
    else {
      obj->ordered_bumped = 0;
    }
  }
  return;
}

Assistant:

static void
__kmp_dispatch_finish( int gtid, ident_t *loc )
{
    typedef typename traits_t< UT >::signed_t ST;
    kmp_info_t *th = __kmp_threads[ gtid ];

    KD_TRACE(100, ("__kmp_dispatch_finish: T#%d called\n", gtid ) );
    if ( ! th -> th.th_team -> t.t_serialized ) {

        dispatch_private_info_template< UT > * pr =
            reinterpret_cast< dispatch_private_info_template< UT >* >
            ( th->th.th_dispatch->th_dispatch_pr_current );
        dispatch_shared_info_template< UT > volatile * sh =
            reinterpret_cast< dispatch_shared_info_template< UT >volatile* >
            ( th->th.th_dispatch->th_dispatch_sh_current );
        KMP_DEBUG_ASSERT( pr );
        KMP_DEBUG_ASSERT( sh );
        KMP_DEBUG_ASSERT( th->th.th_dispatch ==
                 &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid] );

        if ( pr->ordered_bumped ) {
            KD_TRACE(1000, ("__kmp_dispatch_finish: T#%d resetting ordered_bumped to zero\n",
                            gtid ) );
            pr->ordered_bumped = 0;
        } else {
            UT lower = pr->u.p.ordered_lower;

            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_finish: T#%%d before wait: ordered_iteration:%%%s lower:%%%s\n",
                    traits_t< UT >::spec, traits_t< UT >::spec );
                KD_TRACE(1000, ( buff, gtid, sh->u.s.ordered_iteration, lower ) );
                __kmp_str_free( &buff );
            }
            #endif

            __kmp_wait_yield< UT >(&sh->u.s.ordered_iteration, lower, __kmp_ge< UT >
                                   USE_ITT_BUILD_ARG(NULL)
                                   );
            KMP_MB();  /* is this necessary? */
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_finish: T#%%d after wait: ordered_iteration:%%%s lower:%%%s\n",
                    traits_t< UT >::spec, traits_t< UT >::spec );
                KD_TRACE(1000, ( buff, gtid, sh->u.s.ordered_iteration, lower ) );
                __kmp_str_free( &buff );
            }
            #endif

            test_then_inc< ST >( (volatile ST *) & sh->u.s.ordered_iteration );
        } // if
    } // if
    KD_TRACE(100, ("__kmp_dispatch_finish: T#%d returned\n", gtid ) );
}